

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderNegativeTests.cpp
# Opt level: O3

int __thiscall deqp::ShaderNegativeTests::init(ShaderNegativeTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"initialize",
             "Verify initialization of globals with non-constant expressions fails on ES.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b8e0;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"constant_sequence",
             "Verify that the sequence operator cannot be used as a constant expression.");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210b930;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void ShaderNegativeTests::init(void)
{
	addChild(new ShaderUniformInitializeGlobalCase(
		m_context, "initialize", "Verify initialization of globals with non-constant expressions fails on ES.",
		m_glslVersion));
#if 0
	/*
	 * This test is disabled for now since not all existing implementations follow these rules
	 * and enforcing them now would break existing applications, which is unacceptable.
	 *
	 * See https://cvs.khronos.org/bugzilla/show_bug.cgi?id=13922 for further details.
	 */
	addChild(new ShaderUniformPrecisionLinkCase(m_context, "uniform_precision_matching",
			"Verify that linking fails if precision qualifiers on default uniform do not match",
			m_glslVersion));
#endif
	addChild(new ShaderConstantSequenceExpressionCase(
		m_context, "constant_sequence", "Verify that the sequence operator cannot be used as a constant expression.",
		m_glslVersion));
}